

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::HFE::get_track_at_position(HFE *this,Address address)

{
  byte bVar1;
  mutex *__m;
  ushort *puVar2;
  byte *pbVar3;
  size_t __nbytes;
  Address in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  reference rVar4;
  shared_ptr<Storage::Disk::Track> sVar5;
  undefined1 local_160 [16];
  reference local_150;
  reference local_140;
  reference local_130;
  reference local_120;
  reference local_110;
  reference local_100;
  reference local_f0;
  reference local_e0;
  size_type local_d0;
  size_t base;
  undefined1 local_c0 [6];
  uint16_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> section;
  int local_a0 [3];
  uint16_t length;
  uint16_t c;
  uint16_t local_8e;
  uint16_t track_length;
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> lock_guard;
  PCMSegment segment;
  HFE *this_local;
  Address address_local;
  
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)address;
  PCMSegment::PCMSegment((PCMSegment *)&lock_guard);
  __m = FileHolder::get_file_access_mutex((FileHolder *)((long)address + 8));
  std::lock_guard<std::mutex>::lock_guard(&local_80,__m);
  local_8e = seek_track((HFE *)address,in_RDX);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&segment,(ulong)local_8e << 3,false);
  local_a0[1]._2_2_ = 0;
  while ((ushort)local_a0[1]._2_2_ < local_8e) {
    local_a0[0] = 0x100;
    __nbytes = (size_t)(ushort)local_a0[1]._2_2_;
    section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (uint)local_8e - (uint)(ushort)local_a0[1]._2_2_;
    puVar2 = (ushort *)
             std::min<int>(local_a0,(int *)((long)&section.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
    local_a0[1]._0_2_ = *puVar2;
    FileHolder::read((FileHolder *)local_c0,address.head + 8,
                     (void *)(ulong)(ushort)(undefined2)local_a0[1],__nbytes);
    for (base._6_2_ = 0; base._6_2_ < (ushort)(undefined2)local_a0[1]; base._6_2_ = base._6_2_ + 1)
    {
      local_d0 = (size_type)(((uint)(ushort)local_a0[1]._2_2_ + (uint)base._6_2_) * 8);
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0);
      local_e0 = rVar4;
      std::_Bit_reference::operator=(&local_e0,(bool)(bVar1 & 1));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 1);
      local_f0 = rVar4;
      std::_Bit_reference::operator=(&local_f0,SUB41((bVar1 & 2) >> 1,0));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 2);
      local_100 = rVar4;
      std::_Bit_reference::operator=(&local_100,SUB41((bVar1 & 4) >> 2,0));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 3);
      local_110 = rVar4;
      std::_Bit_reference::operator=(&local_110,SUB41((bVar1 & 8) >> 3,0));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 4);
      local_120 = rVar4;
      std::_Bit_reference::operator=(&local_120,SUB41((bVar1 & 0x10) >> 4,0));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 5);
      local_130 = rVar4;
      std::_Bit_reference::operator=(&local_130,SUB41((bVar1 & 0x20) >> 5,0));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 6);
      local_140 = rVar4;
      std::_Bit_reference::operator=(&local_140,SUB41((bVar1 & 0x40) >> 6,0));
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,
                          (ulong)base._6_2_);
      bVar1 = *pbVar3;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&segment,local_d0 + 7);
      local_150 = rVar4;
      std::_Bit_reference::operator=(&local_150,(bool)(bVar1 >> 7));
    }
    local_a0[1]._2_2_ = local_a0[1]._2_2_ + (undefined2)local_a0[1];
    FileHolder::seek((FileHolder *)((long)address + 8),0x100,1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_80);
  std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment&>((PCMSegment *)local_160);
  std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
            ((shared_ptr<Storage::Disk::Track> *)this,
             (shared_ptr<Storage::Disk::PCMTrack> *)local_160);
  std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
            ((shared_ptr<Storage::Disk::PCMTrack> *)local_160);
  PCMSegment::~PCMSegment((PCMSegment *)&lock_guard);
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> HFE::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		uint16_t track_length = seek_track(address);

		segment.data.resize(track_length * 8);

		// HFE tracks are stored as 256 bytes for side 1, then 256 bytes for side 2,
		// then 256 bytes for side 1, then 256 bytes for side 2, etc, until the final
		// 512-byte segment which will contain less than the full 256 bytes.
		//
		// seek_track will have advanced an extra initial 256 bytes if the address
		// refers to side 2, so the loop below can act ass though it were definitely
		// dealing with side 1.
		uint16_t c = 0;
		while(c < track_length) {
			// Decide how many bytes of at most 256 to read, and read them.
			uint16_t length = uint16_t(std::min(256, track_length - c));
			std::vector<uint8_t> section = file_.read(length);

			// Push those into the PCMSegment. In HFE the least-significant bit is
			// serialised first. TODO: move this logic to PCMSegment.
			for(uint16_t byte = 0; byte < length; ++byte) {
				const size_t base = size_t(c + byte) << 3;
				segment.data[base + 0] = !!(section[byte] & 0x01);
				segment.data[base + 1] = !!(section[byte] & 0x02);
				segment.data[base + 2] = !!(section[byte] & 0x04);
				segment.data[base + 3] = !!(section[byte] & 0x08);
				segment.data[base + 4] = !!(section[byte] & 0x10);
				segment.data[base + 5] = !!(section[byte] & 0x20);
				segment.data[base + 6] = !!(section[byte] & 0x40);
				segment.data[base + 7] = !!(section[byte] & 0x80);
			}

			// Advance the target pointer, and skip the next 256 bytes of the file
			// (which will be for the other side of the disk).
			c += length;
			file_.seek(256, SEEK_CUR);
		}
	}

	return std::make_shared<PCMTrack>(segment);
}